

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_and_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  miniscript_node_t *pmVar4;
  miniscript_node_t *pmVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  iVar6 = 0;
  pmVar4 = node->child;
  for (pmVar5 = pmVar4; pmVar5 != (miniscript_node_t *)0x0; pmVar5 = pmVar5->next) {
    iVar6 = iVar6 + 1;
  }
  bVar8 = iVar6 == node->info->inner_num;
  if (!bVar8) {
    return (uint)bVar8 * 2 + -2;
  }
  uVar2 = pmVar4->type_properties;
  uVar3 = pmVar4->next->type_properties;
  uVar7 = uVar3 & uVar2;
  node->type_properties =
       ((uVar3 | uVar2) * 2 & (uVar3 | uVar2) & 0x200) +
       (uVar3 & 0x8000 | uVar2 & 0x8400 | uVar7 & 0x10900 | uVar3 >> 3 & uVar2 & 1) + 0x21000;
  if ((uVar2 >> 8 & 1) != 0) {
    node->type_properties = node->type_properties | uVar3 & 0x400;
  }
  if ((short)uVar7 < 0) {
    node->type_properties = node->type_properties | uVar7 & 0x2000;
  }
  if ((((~uVar3 & 0xc000) != 0) && ((uVar2 & 0xc000) != 0xc000)) && ((uVar7 & 0x4000) == 0)) {
    return 0;
  }
  pbVar1 = (byte *)((long)&node->type_properties + 1);
  *pbVar1 = *pbVar1 | 0x40;
  return 0;
}

Assistant:

static int verify_miniscript_and_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_M);
    node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_S;
    node->type_properties |= x_prop & MINISCRIPT_PROPERTY_N;
    if (y_prop & MINISCRIPT_TYPE_W)
        node->type_properties |= x_prop & MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (x_prop & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= y_prop & MINISCRIPT_PROPERTY_N;
    if ((x_prop & y_prop) & MINISCRIPT_PROPERTY_S)
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_E;
    if (((x_prop & y_prop) & MINISCRIPT_PROPERTY_F) ||
        !(~x_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)) ||
        !(~y_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)))
        node->type_properties |= MINISCRIPT_PROPERTY_F;

    return WALLY_OK;
}